

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O2

void __thiscall hwnet::http::HttpRequest::WriteHeader(HttpRequest *this,function<void_()> *writeOk)

{
  element_type *callback;
  function<void_()> *this_00;
  undefined1 local_98 [16];
  function<void_()> local_88;
  undefined1 local_68 [8];
  string header;
  
  local_68 = (undefined1  [8])&header._M_string_length;
  header._M_dataplus._M_p = (pointer)0x0;
  header._M_string_length._0_1_ = 0;
  HttpPacket::MakeHeader
            ((this->packet).super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,1,(string *)local_68);
  if ((writeOk->super__Function_base)._M_manager != (_Manager_type)0x0) {
    callback = (((this->session).
                 super___shared_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->s
               ).super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::function<void_()>::function((function<void_()> *)(local_98 + 0x10),writeOk);
    header.field_2._8_8_ = 0;
    this_00 = (function<void_()> *)operator_new(0x20);
    std::function<void_()>::function(this_00,(function<void_()> *)(local_98 + 0x10));
    header.field_2._8_8_ = this_00;
    TCPSocket::SetFlushCallback((TCPSocket *)local_98,(FlushCallback *)callback);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
    std::_Function_base::~_Function_base((_Function_base *)((long)&header.field_2 + 8));
    std::_Function_base::~_Function_base((_Function_base *)(local_98 + 0x10));
  }
  HttpSession::Send((this->session).
                    super___shared_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void HttpRequest::WriteHeader(const std::function<void ()> &writeOk) {
	std::string header;
	this->packet->MakeHeader(HttpPacket::request,header);
	if(writeOk){
		this->session->s->SetFlushCallback([writeOk](const TCPSocket::Ptr &_){
			(void)_;	
			writeOk();
		});
	}
	this->session->Send(header);
}